

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

size_t zt_cstr_int_display_len(int value)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = 1 - (value >> 0x1f);
  uVar3 = value - 1000;
  while (uVar3 < 0xfffff831) {
    iVar4 = iVar4 + 3;
    iVar2 = value >> 0x1f;
    iVar1 = value / 1000 + iVar2;
    value = iVar1 - iVar2;
    uVar3 = (iVar1 - iVar2) - 1000;
  }
  uVar3 = 2;
  if (0xffffff38 < value - 100U) {
    uVar3 = (uint)(value - 10U < 0xffffffed);
  }
  return (ulong)(uVar3 + iVar4);
}

Assistant:

size_t zt_cstr_int_display_len(int value)
{
    int result;
    result = value >= 0 ? 1 : 2;

    while ((value >= 1000) || (value <= -1000)) {
        result += 3;
        value /= 1000;
    }

    if ((value >= 100) || (value <= -100)) {
        return result + 2;
    }

    if ((value >= 10) || (value <= -10)) {
        return result + 1;
    }

    return result;
}